

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcrepl.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::FunctionReplacer::toReplacerPattern
          (FunctionReplacer *this,UnicodeString *rule,UBool escapeUnprintable)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UnicodeString *srcText;
  undefined7 in_register_00000011;
  ConstChar16Ptr local_88;
  ConstChar16Ptr local_80;
  UChar *local_78;
  UChar *local_68;
  UnicodeString str;
  
  str.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00471e80;
  str.fUnion.fStackFields.fLengthAndFlags = 2;
  icu_63::UnicodeString::truncate(rule,(char *)0x0,CONCAT71(in_register_00000011,escapeUnprintable))
  ;
  icu_63::UnicodeString::append(rule,L'&');
  iVar1 = (*(this->translit->super_UObject)._vptr_UObject[0xd])();
  icu_63::UnicodeString::append(rule,(UnicodeString *)CONCAT44(extraout_var,iVar1));
  local_80.p_ = L"( ";
  icu_63::UnicodeString::append(rule,&local_80,2);
  local_68 = local_80.p_;
  iVar1 = (*(this->replacer->super_UObject)._vptr_UObject[5])();
  srcText = (UnicodeString *)
            (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x18))
                      ((long *)CONCAT44(extraout_var_00,iVar1),&str,(int)escapeUnprintable);
  icu_63::UnicodeString::append(rule,srcText);
  local_88.p_ = L" )";
  icu_63::UnicodeString::append(rule,&local_88,2);
  local_78 = local_88.p_;
  icu_63::UnicodeString::~UnicodeString(&str);
  return rule;
}

Assistant:

UnicodeString& FunctionReplacer::toReplacerPattern(UnicodeString& rule,
                                                   UBool escapeUnprintable) const {
    UnicodeString str;
    rule.truncate(0);
    rule.append(AMPERSAND);
    rule.append(translit->getID());
    rule.append(OPEN, 2);
    rule.append(replacer->toReplacer()->toReplacerPattern(str, escapeUnprintable));
    rule.append(CLOSE, 2);
    return rule;
}